

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall RefTable::Resize(RefTable *this,SQUnsignedInteger size)

{
  SQUnsignedInteger *in_RDI;
  RefNode *nn;
  SQUnsignedInteger n;
  SQUnsignedInteger nfound;
  SQUnsignedInteger oldnumofslots;
  RefNode *t;
  RefNode **oldbucks;
  RefNode *in_stack_ffffffffffffffc0;
  ulong local_38;
  SQObject *obj;
  SQUnsignedInteger size_00;
  RefTable *this_00;
  
  this_00 = (RefTable *)in_RDI[2];
  size_00 = *in_RDI;
  AllocNodes(this_00,size_00);
  obj = (SQObject *)0x0;
  for (local_38 = 0; local_38 < size_00; local_38 = local_38 + 1) {
    if ((int)this_00->_numofslots != 0x1000001) {
      HashObj((SQObjectPtr *)this_00);
      in_stack_ffffffffffffffc0 = Add(this_00,size_00,obj);
      in_stack_ffffffffffffffc0->refs = (SQUnsignedInteger)this_00->_nodes;
      ::SQObjectPtr::Null(&in_stack_ffffffffffffffc0->obj);
      obj = (SQObject *)((long)&obj->_type + 1);
    }
    this_00 = (RefTable *)&this_00->_buckets;
  }
  sq_vm_free(in_stack_ffffffffffffffc0,(SQUnsignedInteger)in_RDI);
  return;
}

Assistant:

void RefTable::Resize(SQUnsignedInteger size)
{
    RefNode **oldbucks = _buckets;
    RefNode *t = _nodes;
    SQUnsignedInteger oldnumofslots = _numofslots;
    AllocNodes(size);
    //rehash
    SQUnsignedInteger nfound = 0;
    for(SQUnsignedInteger n = 0; n < oldnumofslots; n++) {
        if(type(t->obj) != OT_NULL) {
            //add back;
            assert(t->refs != 0);
            RefNode *nn = Add(::HashObj(t->obj)&(_numofslots-1),t->obj);
            nn->refs = t->refs;
            t->obj.Null();
            nfound++;
        }
        t++;
    }
    assert(nfound == oldnumofslots);
    SQ_FREE(oldbucks,(oldnumofslots * sizeof(RefNode *)) + (oldnumofslots * sizeof(RefNode)));
}